

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

cmValue __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  char cVar1;
  size_t __n;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  cmValue cVar9;
  cmState *this_00;
  long *plVar10;
  string *this_01;
  long lVar11;
  string_view separator;
  string_view separator_00;
  string_view separator_01;
  string_view separator_02;
  string_view separator_03;
  string_view separator_04;
  string_view separator_05;
  string_view separator_06;
  string_view separator_07;
  string_view separator_08;
  string_view separator_09;
  string_view separator_10;
  pair<bool,_cmValue> pVar12;
  undefined1 local_342;
  undefined1 local_341;
  cmStateSnapshot local_340;
  undefined1 local_328 [32];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar5 != 0)) {
    local_328._0_8_ = local_328 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_328,(anonymous_namespace)::propC_STANDARD_abi_cxx11_,
               DAT_00873960 + (long)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    local_308[0] = local_2f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_,
               DAT_00873980 + (long)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_);
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e8,(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_,
               DAT_008739a0 + (long)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_);
    local_2c8[0] = local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c8,(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_,
               DAT_008739e0 + (long)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_);
    local_2a8[0] = local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a8,(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_,
               DAT_00873a00 + (long)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_);
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_,
               DAT_00873ba0 + (anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    local_268[0] = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,(anonymous_namespace)::propTYPE_abi_cxx11_,
               DAT_00873c20 + (anonymous_namespace)::propTYPE_abi_cxx11_);
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_248,(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               DAT_00873b40 + (anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_,
               DAT_00873a40 + (anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_208,(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_,
               DAT_00873a60 + (anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e8,(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               DAT_00873a20 + (anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_,
               DAT_00873a80 + (anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_,
               DAT_00873b60 + (anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
    local_188[0] = local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_188,(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_,
               DAT_00873b80 + (anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,(anonymous_namespace)::propIMPORTED_abi_cxx11_,
               DAT_00873b00 + (anonymous_namespace)::propIMPORTED_abi_cxx11_);
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_,
               DAT_00873b20 + (anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,(anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
               ,DAT_00873bc0 + (anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,(anonymous_namespace)::propNAME_abi_cxx11_,
               DAT_00873be0 + (anonymous_namespace)::propNAME_abi_cxx11_);
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,(anonymous_namespace)::propBINARY_DIR_abi_cxx11_,
               DAT_00873c40 + (anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_,
               DAT_00873c60 + (anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,(anonymous_namespace)::propSOURCES_abi_cxx11_,
               DAT_00873c00 + (anonymous_namespace)::propSOURCES_abi_cxx11_);
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_,
               DAT_00873cc0 + (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,
               DAT_00873ce0 + (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_)
    ;
    plVar10 = local_38;
    local_48[0] = plVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,
               DAT_00873d00 +
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,local_328,
               &stack0xffffffffffffffd8,0,&local_340,&local_341,&local_342);
    lVar11 = -0x300;
    do {
      if (plVar10 != (long *)plVar10[-2]) {
        operator_delete((long *)plVar10[-2],*plVar10 + 1);
      }
      plVar10 = plVar10 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h,prop);
  if (cVar6.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    __n = prop->_M_string_length;
    if ((((((__n == DAT_00873960) &&
           ((__n == 0 ||
            (iVar5 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propC_STANDARD_abi_cxx11_,
                          __n), iVar5 == 0)))) ||
          ((__n == DAT_00873980 &&
           ((__n == 0 ||
            (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propCXX_STANDARD_abi_cxx11_,__n), iVar5 == 0))))))
         || ((__n == DAT_008739a0 &&
             ((__n == 0 ||
              (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                            (anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_,__n), iVar5 == 0))))
            )) || ((__n == DAT_008739e0 &&
                   ((__n == 0 ||
                    (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                                  (anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_,__n),
                    iVar5 == 0)))))) ||
       ((__n == DAT_00873a00 &&
        ((__n == 0 ||
         (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                       (anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_,__n), iVar5 == 0))))))
    {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::find(&(((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LanguageStandardProperties)._M_t,prop);
      if (iVar7._M_node !=
          (_Base_ptr)
          ((long)&((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  LanguageStandardProperties + 8U)) {
        return (cmValue)(iVar7._M_node + 2);
      }
      return (cmValue)(_Base_ptr)0x0;
    }
    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    if (_Var3) {
      _Var2._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      if (*(pointer *)
           &((_Var2._M_head_impl)->LinkImplementationPropertyEntries).
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          == *(pointer *)((long)&(_Var2._M_head_impl)->LinkImplementationPropertyEntries + 8)) {
        return (cmValue)(_Base_ptr)0x0;
      }
      if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
        GetProperty();
      }
      separator._M_str = ";";
      separator._M_len = 1;
      cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                ((string *)local_328,
                 &((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  LinkImplementationPropertyEntries,separator);
      this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
    }
    else {
      _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&(anonymous_namespace)::
                                       propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
      if (_Var3) {
        _Var2._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        if (*(pointer *)
             &((_Var2._M_head_impl)->LinkInterfacePropertyEntries).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            == *(pointer *)((long)&(_Var2._M_head_impl)->LinkInterfacePropertyEntries + 8)) {
          return (cmValue)(_Base_ptr)0x0;
        }
        if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        separator_00._M_str = ";";
        separator_00._M_len = 1;
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  ((string *)local_328,
                   &((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    LinkInterfacePropertyEntries,separator_00);
        this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
      }
      else {
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::
                                         propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
        if (_Var3) {
          _Var2._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          if (*(pointer *)
               &((_Var2._M_head_impl)->LinkInterfaceDirectPropertyEntries).
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              == *(pointer *)((long)&(_Var2._M_head_impl)->LinkInterfaceDirectPropertyEntries + 8))
          {
            return (cmValue)(_Base_ptr)0x0;
          }
          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          separator_01._M_str = ";";
          separator_01._M_len = 1;
          cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                    ((string *)local_328,
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfaceDirectPropertyEntries,separator_01);
          this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
        }
        else {
          _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&(anonymous_namespace)::
                                           propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
          if (_Var3) {
            _Var2._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            if (*(pointer *)
                 &((_Var2._M_head_impl)->LinkInterfaceDirectExcludePropertyEntries).
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                == *(pointer *)
                    ((long)&(_Var2._M_head_impl)->LinkInterfaceDirectExcludePropertyEntries + 8)) {
              return (cmValue)(_Base_ptr)0x0;
            }
            if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
              GetProperty();
            }
            separator_02._M_str = ";";
            separator_02._M_len = 1;
            cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                      ((string *)local_328,
                       &((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        LinkInterfaceDirectExcludePropertyEntries,separator_02);
            this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
          }
          else {
            _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&(anonymous_namespace)::propTYPE_abi_cxx11_);
            if (_Var3) {
              p_Var8 = (_Base_ptr)
                       cmState::GetTargetTypeName_abi_cxx11_
                                 (((this->impl)._M_t.
                                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                  ->TargetType);
              return (cmValue)p_Var8;
            }
            _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&(anonymous_namespace)::
                                             propINCLUDE_DIRECTORIES_abi_cxx11_);
            if (_Var3) {
              _Var2._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              if (*(pointer *)
                   &((_Var2._M_head_impl)->IncludeDirectoriesEntries).
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  == *(pointer *)((long)&(_Var2._M_head_impl)->IncludeDirectoriesEntries + 8)) {
                return (cmValue)(_Base_ptr)0x0;
              }
              if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                GetProperty();
              }
              separator_03._M_str = ";";
              separator_03._M_len = 1;
              cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                        ((string *)local_328,
                         &((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          IncludeDirectoriesEntries,separator_03);
              this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
            }
            else {
              _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&(anonymous_namespace)::
                                               propCOMPILE_FEATURES_abi_cxx11_);
              if (_Var3) {
                _Var2._M_head_impl =
                     (this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                if (*(pointer *)
                     &((_Var2._M_head_impl)->CompileFeaturesEntries).
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    == *(pointer *)((long)&(_Var2._M_head_impl)->CompileFeaturesEntries + 8)) {
                  return (cmValue)(_Base_ptr)0x0;
                }
                if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                  GetProperty();
                }
                separator_04._M_str = ";";
                separator_04._M_len = 1;
                cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                          ((string *)local_328,
                           &((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            CompileFeaturesEntries,separator_04);
                this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
              }
              else {
                _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&(anonymous_namespace)::
                                                 propCOMPILE_OPTIONS_abi_cxx11_);
                if (_Var3) {
                  _Var2._M_head_impl =
                       (this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                  if (*(pointer *)
                       &((_Var2._M_head_impl)->CompileOptionsEntries).
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      == *(pointer *)((long)&(_Var2._M_head_impl)->CompileOptionsEntries + 8)) {
                    return (cmValue)(_Base_ptr)0x0;
                  }
                  if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                    GetProperty();
                  }
                  separator_05._M_str = ";";
                  separator_05._M_len = 1;
                  cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                            ((string *)local_328,
                             &((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              CompileOptionsEntries,separator_05);
                  this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                }
                else {
                  _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&(anonymous_namespace)::
                                                   propCOMPILE_DEFINITIONS_abi_cxx11_);
                  if (_Var3) {
                    _Var2._M_head_impl =
                         (this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                    if (*(pointer *)
                         &((_Var2._M_head_impl)->CompileDefinitionsEntries).
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        == *(pointer *)((long)&(_Var2._M_head_impl)->CompileDefinitionsEntries + 8))
                    {
                      return (cmValue)(_Base_ptr)0x0;
                    }
                    if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                      GetProperty();
                    }
                    separator_06._M_str = ";";
                    separator_06._M_len = 1;
                    cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                              ((string *)local_328,
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                CompileDefinitionsEntries,separator_06);
                    this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                  }
                  else {
                    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propLINK_OPTIONS_abi_cxx11_);
                    if (_Var3) {
                      _Var2._M_head_impl =
                           (this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                      if (*(pointer *)
                           &((_Var2._M_head_impl)->LinkOptionsEntries).
                            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          == *(pointer *)((long)&(_Var2._M_head_impl)->LinkOptionsEntries + 8)) {
                        return (cmValue)(_Base_ptr)0x0;
                      }
                      if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                        GetProperty();
                      }
                      separator_07._M_str = ";";
                      separator_07._M_len = 1;
                      cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                                ((string *)local_328,
                                 &((this->impl)._M_t.
                                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                  ->LinkOptionsEntries,separator_07);
                      this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                    }
                    else {
                      _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propLINK_DIRECTORIES_abi_cxx11_);
                      if (_Var3) {
                        _Var2._M_head_impl =
                             (this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                        if (*(pointer *)
                             &((_Var2._M_head_impl)->LinkDirectoriesEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            == *(pointer *)((long)&(_Var2._M_head_impl)->LinkDirectoriesEntries + 8)
                           ) {
                          return (cmValue)(_Base_ptr)0x0;
                        }
                        if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                          GetProperty();
                        }
                        separator_08._M_str = ";";
                        separator_08._M_len = 1;
                        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                                  ((string *)local_328,
                                   &((this->impl)._M_t.
                                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl
                                    )->LinkDirectoriesEntries,separator_08);
                        this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                      }
                      else {
                        _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
                        if (_Var3) {
                          if (*(size_t *)
                               ((long)&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->Utilities + 0x28) == 0) {
                            return (cmValue)(_Base_ptr)0x0;
                          }
                          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                            GetProperty();
                          }
                          if (GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_ == '\0'
                             ) {
                            GetProperty();
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::resize(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
                                   *(size_t *)
                                    ((long)&((this->impl)._M_t.
                                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                             .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                            _M_head_impl)->Utilities + 0x28));
                          _Var2._M_head_impl =
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                          std::
                          transform<std::_Rb_tree_const_iterator<BT<std::pair<std::__cxx11::string,bool>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmTarget::GetProperty(std::__cxx11::string_const&)const::__0>
                                    (*(_Base_ptr *)((long)&(_Var2._M_head_impl)->Utilities + 0x18),
                                     (_Rb_tree_header *)((long)&(_Var2._M_head_impl)->Utilities + 8)
                                     ,GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                          separator_09._M_str = ";";
                          separator_09._M_len = 1;
                          cmJoin((string *)local_328,
                                 &GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
                                 separator_09,(string_view)ZEXT816(0));
                          this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                        }
                        else {
                          _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propPRECOMPILE_HEADERS_abi_cxx11_);
                          if (!_Var3) {
                            _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::propIMPORTED_abi_cxx11_)
                            ;
                            if (_Var3) {
                              cVar1 = ((this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                      _M_head_impl)->IsImportedTarget;
                            }
                            else {
                              _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propIMPORTED_GLOBAL_abi_cxx11_);
                              if (!_Var3) {
                                _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::propNAME_abi_cxx11_);
                                if (_Var3) {
                                  return (cmValue)(_Base_ptr)
                                                  &((this->impl)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>
                                                  ._M_head_impl)->Name;
                                }
                                _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propBINARY_DIR_abi_cxx11_);
                                if (_Var3) {
                                  cmMakefile::GetStateSnapshot
                                            (((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->Makefile);
                                  cmStateSnapshot::GetDirectory
                                            ((cmStateDirectory *)local_328,&local_340);
                                  p_Var8 = (_Base_ptr)
                                           cmStateDirectory::GetCurrentBinary_abi_cxx11_
                                                     ((cmStateDirectory *)local_328);
                                  return (cmValue)p_Var8;
                                }
                                _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&(anonymous_namespace)::
                                                     propSOURCE_DIR_abi_cxx11_);
                                if (_Var3) {
                                  cmMakefile::GetStateSnapshot
                                            (((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->Makefile);
                                  cmStateSnapshot::GetDirectory
                                            ((cmStateDirectory *)local_328,&local_340);
                                  p_Var8 = (_Base_ptr)
                                           cmStateDirectory::GetCurrentSource_abi_cxx11_
                                                     ((cmStateDirectory *)local_328);
                                  return (cmValue)p_Var8;
                                }
                                goto LAB_0045a5a4;
                              }
                              cVar1 = ((this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                      _M_head_impl)->ImportedGloballyVisible;
                            }
                            if (cVar1 != '\0') {
                              return (cmValue)(anonymous_namespace)::propTRUE_abi_cxx11_;
                            }
                            return (cmValue)(anonymous_namespace)::propFALSE_abi_cxx11_;
                          }
                          _Var2._M_head_impl =
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                          if (*(pointer *)
                               &((_Var2._M_head_impl)->PrecompileHeadersEntries).
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              == *(pointer *)
                                  ((long)&(_Var2._M_head_impl)->PrecompileHeadersEntries + 8)) {
                            return (cmValue)(_Base_ptr)0x0;
                          }
                          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                            GetProperty();
                          }
                          separator_10._M_str = ";";
                          separator_10._M_len = 1;
                          cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                                    ((string *)local_328,
                                     &((this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                      _M_head_impl)->PrecompileHeadersEntries,separator_10);
                          this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::operator=((string *)this_01,(string *)local_328);
    if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    return (cmValue)this_01;
  }
LAB_0045a5a4:
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pVar12 = anon_unknown.dwarf_1b5905c::FileSetType::ReadProperties
                     (&(_Var2._M_head_impl)->HeadersFileSets,this,_Var2._M_head_impl,prop);
  if ((((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
     (_Var2._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl,
     pVar12 = anon_unknown.dwarf_1b5905c::FileSetType::ReadProperties
                        (&(_Var2._M_head_impl)->CxxModulesFileSets,this,_Var2._M_head_impl,prop),
     ((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
    _Var2._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    pVar12 = anon_unknown.dwarf_1b5905c::FileSetType::ReadProperties
                       (&(_Var2._M_head_impl)->CxxModuleHeadersFileSets,this,_Var2._M_head_impl,prop
                       );
    cVar9 = pVar12.second.Value;
    bVar4 = ((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  }
  else {
    cVar9 = pVar12.second.Value;
    bVar4 = false;
  }
  if (!bVar4) {
    return (cmValue)cVar9.Value;
  }
  cVar9 = cmPropertyMap::GetPropertyValue
                    (&((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Properties,
                     prop);
  if (cVar9.Value != (string *)0x0) {
    return (cmValue)cVar9.Value;
  }
  this_00 = cmMakefile::GetState
                      (((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
  bVar4 = cmState::IsPropertyChained(this_00,prop,TARGET);
  if (bVar4) {
    cmMakefile::GetStateSnapshot
              (((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_328,&local_340);
    cVar9 = cmStateDirectory::GetProperty((cmStateDirectory *)local_328,prop,true);
    return (cmValue)cVar9.Value;
  }
  return (cmValue)(_Base_ptr)0x0;
}

Assistant:

cmValue cmTarget::GetProperty(const std::string& prop) const
{
  static std::unordered_set<std::string> const specialProps{
    propC_STANDARD,
    propCXX_STANDARD,
    propCUDA_STANDARD,
    propOBJC_STANDARD,
    propOBJCXX_STANDARD,
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propPRECOMPILE_HEADERS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES,
    propINTERFACE_LINK_LIBRARIES,
    propINTERFACE_LINK_LIBRARIES_DIRECT,
    propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
  };
  if (specialProps.count(prop)) {
    if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
        prop == propCUDA_STANDARD || prop == propOBJC_STANDARD ||
        prop == propOBJCXX_STANDARD) {
      auto propertyIter = this->impl->LanguageStandardProperties.find(prop);
      if (propertyIter == this->impl->LanguageStandardProperties.end()) {
        return nullptr;
      }
      return cmValue(propertyIter->second.Value);
    }
    if (prop == propLINK_LIBRARIES) {
      if (this->impl->LinkImplementationPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkImplementationPropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES) {
      if (this->impl->LinkInterfacePropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkInterfacePropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
      if (this->impl->LinkInterfaceDirectPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkInterfaceDirectPropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
      if (this->impl->LinkInterfaceDirectExcludePropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output =
        cmJoin(this->impl->LinkInterfaceDirectExcludePropertyEntries, ";");
      return cmValue(output);
    }
    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmValue(cmState::GetTargetTypeName(this->GetType()));
    }
    if (prop == propINCLUDE_DIRECTORIES) {
      if (this->impl->IncludeDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->IncludeDirectoriesEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_FEATURES) {
      if (this->impl->CompileFeaturesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileFeaturesEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_OPTIONS) {
      if (this->impl->CompileOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileOptionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_DEFINITIONS) {
      if (this->impl->CompileDefinitionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileDefinitionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propLINK_OPTIONS) {
      if (this->impl->LinkOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkOptionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propLINK_DIRECTORIES) {
      if (this->impl->LinkDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkDirectoriesEntries, ";");

      return cmValue(output);
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      static std::vector<std::string> utilities;
      utilities.resize(this->impl->Utilities.size());
      std::transform(
        this->impl->Utilities.cbegin(), this->impl->Utilities.cend(),
        utilities.begin(),
        [](const BT<std::pair<std::string, bool>>& item) -> std::string {
          return item.Value.first;
        });
      output = cmJoin(utilities, ";");
      return cmValue(output);
    }
    if (prop == propPRECOMPILE_HEADERS) {
      if (this->impl->PrecompileHeadersEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->PrecompileHeadersEntries, ";");
      return cmValue(output);
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? cmValue(propTRUE) : cmValue(propFALSE);
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? cmValue(propTRUE)
                                               : cmValue(propFALSE);
    }
    if (prop == propNAME) {
      return cmValue(this->GetName());
    }
    if (prop == propBINARY_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentBinary());
    }
    if (prop == propSOURCE_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentSource());
    }
  }

  // Check fileset properties.
  {
    auto headers =
      this->impl->HeadersFileSets.ReadProperties(this, this->impl.get(), prop);
    if (headers.first) {
      return headers.second;
    }
    auto cxx_modules = this->impl->CxxModulesFileSets.ReadProperties(
      this, this->impl.get(), prop);
    if (cxx_modules.first) {
      return cxx_modules.second;
    }
    auto cxx_module_headers =
      this->impl->CxxModuleHeadersFileSets.ReadProperties(
        this, this->impl.get(), prop);
    if (cxx_module_headers.first) {
      return cxx_module_headers.second;
    }
  }

  cmValue retVal = this->impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->impl->Makefile->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetProperty(prop, chain);
    }
    return nullptr;
  }
  return retVal;
}